

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HexBin.cpp
# Opt level: O1

XMLCh * xercesc_4_0::HexBin::getCanonicalRepresentation(XMLCh *hexData,MemoryManager *manager)

{
  short *psVar1;
  int iVar2;
  XMLCh *toUpperCase;
  size_t __n;
  undefined4 extraout_var;
  
  iVar2 = getDataLength(hexData);
  if (iVar2 == -1) {
    toUpperCase = (XMLCh *)0x0;
  }
  else {
    if (hexData == (XMLCh *)0x0) {
      toUpperCase = (XMLCh *)0x0;
    }
    else {
      __n = 0;
      do {
        psVar1 = (short *)((long)hexData + __n);
        __n = __n + 2;
      } while (*psVar1 != 0);
      iVar2 = (*manager->_vptr_MemoryManager[3])(manager,__n);
      toUpperCase = (XMLCh *)CONCAT44(extraout_var,iVar2);
      memcpy(toUpperCase,hexData,__n);
    }
    XMLString::upperCaseASCII(toUpperCase);
  }
  return toUpperCase;
}

Assistant:

XMLCh* HexBin::getCanonicalRepresentation(const XMLCh*          const hexData
                                        ,       MemoryManager*  const manager)
{

    if (getDataLength(hexData) == -1)
        return 0;

    XMLCh* retStr = XMLString::replicate(hexData, manager);
    XMLString::upperCaseASCII(retStr);

    return retStr;
}